

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_tree_builder.h
# Opt level: O1

vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
* __thiscall
bvh::v2::MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int>::prune_mini_trees
          (vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
           *__return_storage_ptr__,
          MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int> *this,
          vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
          *mini_trees)

{
  ulong uVar1;
  pointer pBVar2;
  pointer pNVar3;
  ThreadPool *pTVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  ulong uVar8;
  _Elt_pointer puVar9;
  ulong uVar10;
  pointer pBVar11;
  ulong end;
  ulong uVar12;
  vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
  *pvVar13;
  float *pfVar14;
  pointer pBVar15;
  float fVar16;
  undefined1 in_XMM5 [16];
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  pruned_roots;
  value_type node_id;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> stack;
  unique_lock<std::mutex> local_108;
  _Any_data local_f8;
  code *pcStack_e8;
  code *pcStack_e0;
  vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
  *local_d8;
  float local_cc;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_c8;
  MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int> *local_b0;
  anon_class_24_3_47abbb90 local_a8;
  pointer local_90;
  undefined1 local_88 [16];
  _Elt_pointer puStack_78;
  undefined1 auStack_70 [24];
  _Elt_pointer puStack_58;
  _Elt_pointer puStack_50;
  _Elt_pointer puStack_48;
  _Map_pointer ppuStack_40;
  
  pBVar2 = (mini_trees->
           super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  fVar16 = 0.0;
  pBVar15 = (mini_trees->
            super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  for (pBVar11 = pBVar15; pBVar11 != pBVar2; pBVar11 = pBVar11 + 1) {
    pNVar3 = (pBVar11->nodes).
             super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    fVar5 = *(float *)((long)(pNVar3->bounds)._M_elems + 4) - (pNVar3->bounds)._M_elems[0];
    fVar6 = *(float *)((long)(pNVar3->bounds)._M_elems + 0xc) -
            *(float *)((long)(pNVar3->bounds)._M_elems + 8);
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar6)),
                             ZEXT416((uint)(*(float *)((long)(pNVar3->bounds)._M_elems + 0x14) -
                                           *(float *)((long)(pNVar3->bounds)._M_elems + 0x10))),
                             ZEXT416((uint)(fVar5 + fVar6)));
    fVar16 = fVar16 + auVar7._0_4_;
  }
  auVar7 = vcvtusi2ss_avx512f(in_XMM5,((long)pBVar2 - (long)pBVar15 >> 4) * -0x5555555555555555);
  local_cc = (fVar16 / auVar7._0_4_) * this->config_->pruning_area_ratio;
  puStack_48 = (_Elt_pointer)0x0;
  ppuStack_40 = (_Map_pointer)0x0;
  local_88._12_4_ = 0;
  local_88._0_12_ = ZEXT812(0);
  puStack_78 = (_Elt_pointer)0x0;
  auStack_70 = (undefined1  [24])0x0;
  puStack_58 = (_Elt_pointer)0x0;
  puStack_50 = (_Elt_pointer)0x0;
  local_d8 = __return_storage_ptr__;
  local_b0 = this;
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map
            ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_88,0);
  local_c8.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x40;
  local_f8._M_unused._M_object = (mutex *)0x0;
  if ((mini_trees->
      super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (mini_trees->
      super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    do {
      local_a8.pruned_roots =
           (vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            *)0x0;
      std::deque<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)local_88,
                 (unsigned_long *)&local_a8);
      if (puStack_58 != puStack_78) {
        pBVar15 = (mini_trees->
                  super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + local_f8._M_unused._M_member_pointer;
        local_90 = pBVar15;
        do {
          puVar9 = puStack_58;
          if (puStack_58 == puStack_50) {
            puVar9 = ppuStack_40[-1] + 0x40;
          }
          local_a8.pruned_roots =
               (vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                *)puVar9[-1];
          pfVar14 = (float *)((long)local_a8.pruned_roots * 0x1c +
                             *(long *)&(pBVar15->nodes).
                                       super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                       ._M_impl);
          if (puStack_58 == puStack_50) {
            operator_delete(puStack_50,0x200);
            puStack_50 = ppuStack_40[-1];
            puStack_48 = puStack_50 + 0x40;
            puStack_58 = puStack_50 + 0x3f;
            ppuStack_40 = ppuStack_40 + -1;
          }
          else {
            puStack_58 = puStack_58 + -1;
          }
          auVar7 = vfmadd231ss_fma(ZEXT416((uint)((pfVar14[1] - *pfVar14) *
                                                 (pfVar14[3] - pfVar14[2]))),
                                   ZEXT416((uint)(pfVar14[5] - pfVar14[4])),
                                   ZEXT416((uint)((pfVar14[1] - *pfVar14) +
                                                 (pfVar14[3] - pfVar14[2]))));
          if ((auVar7._0_4_ < local_cc) || (((uint)pfVar14[6] & 0xf) != 0)) {
            std::
            vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
            ::emplace_back<unsigned_long&,unsigned_long&>
                      ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                        *)&local_c8,(unsigned_long *)local_f8._M_pod_data,(unsigned_long *)&local_a8
                      );
          }
          else {
            local_108._M_device = (mutex_type *)(ulong)((uint)pfVar14[6] >> 4);
            std::deque<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                      ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)local_88,
                       (unsigned_long *)&local_108);
            local_108._M_device = (mutex_type *)((ulong)((uint)pfVar14[6] >> 4) + 1);
            std::deque<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                      ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)local_88,
                       (unsigned_long *)&local_108);
            pBVar15 = local_90;
          }
        } while (puStack_58 != puStack_78);
      }
      local_f8._M_unused._M_function_pointer = local_f8._M_unused._M_function_pointer + 1;
    } while (local_f8._M_unused._M_object <
             (undefined1 *)
             (((long)(mini_trees->
                     super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(mini_trees->
                     super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555));
  }
  pvVar13 = local_d8;
  std::
  vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
  ::vector(local_d8,(long)local_c8.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_c8.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4,
           (allocator_type *)local_f8._M_pod_data);
  local_a8.pruned_roots = &local_c8;
  end = (long)local_c8.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_c8.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 4;
  local_a8.pruned_trees = pvVar13;
  local_a8.mini_trees = mini_trees;
  if (end < (local_b0->executor_).parallel_threshold) {
    prune_mini_trees::anon_class_24_3_47abbb90::operator()(&local_a8,0,end);
  }
  else {
    pTVar4 = (local_b0->executor_).thread_pool;
    uVar8 = end / (ulong)((long)(pTVar4->threads_).
                                super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(pTVar4->threads_).
                                super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3);
    if (local_c8.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_c8.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar12 = 0;
      do {
        pTVar4 = (local_b0->executor_).thread_pool;
        local_f8._M_unused._M_object = (void *)0x0;
        local_f8._8_8_ = 0;
        pcStack_e8 = (code *)0x0;
        pcStack_e0 = (code *)0x0;
        local_f8._M_unused._M_object = operator_new(0x28);
        uVar1 = uVar12 + uVar8 + (uVar8 == 0);
        uVar10 = end;
        if (uVar1 < end) {
          uVar10 = uVar1;
        }
        *(vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
          **)((long)local_f8._M_unused._0_8_ + 0x10) = local_a8.mini_trees;
        *(vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          **)local_f8._M_unused._0_8_ = local_a8.pruned_roots;
        *(vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
          **)((long)local_f8._M_unused._0_8_ + 8) = local_a8.pruned_trees;
        *(ulong *)((long)local_f8._M_unused._0_8_ + 0x18) = uVar12;
        *(ulong *)((long)local_f8._M_unused._0_8_ + 0x20) = uVar10;
        pcStack_e0 = std::
                     _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/executor.h:58:30)>
                     ::_M_invoke;
        pcStack_e8 = std::
                     _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/executor.h:58:30)>
                     ::_M_manager;
        local_108._M_device = &pTVar4->mutex_;
        local_108._M_owns = false;
        std::unique_lock<std::mutex>::lock(&local_108);
        local_108._M_owns = true;
        std::
        deque<std::function<void(unsigned_long)>,std::allocator<std::function<void(unsigned_long)>>>
        ::emplace_back<std::function<void(unsigned_long)>>
                  ((deque<std::function<void(unsigned_long)>,std::allocator<std::function<void(unsigned_long)>>>
                    *)&pTVar4->tasks_,(function<void_(unsigned_long)> *)&local_f8);
        std::unique_lock<std::mutex>::~unique_lock(&local_108);
        std::condition_variable::notify_one();
        if (pcStack_e8 != (code *)0x0) {
          (*pcStack_e8)(&local_f8,&local_f8,__destroy_functor);
        }
        uVar12 = uVar1;
      } while (uVar1 < end);
    }
    pvVar13 = local_d8;
    pTVar4 = (local_b0->executor_).thread_pool;
    local_f8._M_unused._M_object = &pTVar4->mutex_;
    local_f8._8_8_ = local_f8._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_f8);
    local_f8._M_pod_data[8] = 1;
    while ((pTVar4->busy_count_ != 0 ||
           (((iterator *)
            ((long)&(pTVar4->tasks_).c.
                    super__Deque_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
                    ._M_impl.super__Deque_impl_data + 0x30))->_M_cur !=
            ((iterator *)
            ((long)&(pTVar4->tasks_).c.
                    super__Deque_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
                    ._M_impl.super__Deque_impl_data + 0x10))->_M_cur))) {
      std::condition_variable::wait((unique_lock *)&pTVar4->done_);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_f8);
  }
  if (local_c8.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
            ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_88);
  return pvVar13;
}

Assistant:

std::vector<Bvh<Node>> prune_mini_trees(std::vector<Bvh<Node>>&& mini_trees) {
        // Compute the area threshold based on the area of the entire set of primitives
        auto avg_area = static_cast<Scalar>(0.);
        for (auto& mini_tree : mini_trees)
            avg_area += mini_tree.get_root().get_bbox().get_half_area();
        avg_area /= static_cast<Scalar>(mini_trees.size());
        auto threshold = avg_area * config_.pruning_area_ratio;

        // Cull nodes whose area is above the threshold
        std::stack<size_t> stack;
        std::vector<std::pair<size_t, size_t>> pruned_roots;
        for (size_t i = 0; i < mini_trees.size(); ++i) {
            stack.push(0);
            auto& mini_tree = mini_trees[i];
            while (!stack.empty()) {
                auto node_id = stack.top();
                auto& node = mini_tree.nodes[node_id];
                stack.pop();
                if (node.get_bbox().get_half_area() < threshold || node.is_leaf()) {
                    pruned_roots.emplace_back(i, node_id);
                } else {
                    stack.push(node.index.first_id());
                    stack.push(node.index.first_id() + 1);
                }
            }
        }

        // Extract the BVHs rooted at the previously computed indices
        std::vector<Bvh<Node>> pruned_trees(pruned_roots.size());
        executor_.for_each(0, pruned_roots.size(),
            [&] (size_t begin, size_t end) {
                for (size_t i = begin; i < end; ++i) {
                    if (pruned_roots[i].second == 0)
                        pruned_trees[i] = std::move(mini_trees[pruned_roots[i].first]);
                    else
                        pruned_trees[i] = mini_trees[pruned_roots[i].first]
                            .extract_bvh(pruned_roots[i].second);
                }
            });
        return pruned_trees;
    }